

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O3

bool __thiscall Movie::Verify(Movie *this,Verifier *verifier)

{
  bool bVar1;
  long lVar2;
  Vector<unsigned_char,_unsigned_int> *types;
  String *str;
  ulong uVar3;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *values;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if (!bVar1) {
    return false;
  }
  if ((4 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((ulong)*(ushort *)(this + (4 - (long)*(int *)this)) != 0)) {
    if (verifier->size_ < 2) {
      return false;
    }
    if ((Movie *)(verifier->size_ - 1) <
        this + ((ulong)*(ushort *)(this + (4 - (long)*(int *)this)) - (long)verifier->buf_)) {
      return false;
    }
  }
  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6);
  if (!bVar1) {
    return false;
  }
  lVar2 = -(long)*(int *)this;
  if (*(ushort *)(this + -(long)*(int *)this) < 7) {
    if (4 < *(ushort *)(this + -(long)*(int *)this)) goto LAB_0019aecb;
  }
  else {
    uVar3 = (ulong)*(ushort *)(this + lVar2 + 6);
    if (uVar3 == 0) {
LAB_0019aecb:
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + *(uint *)(this + uVar3) + uVar3);
    }
    if ((ulong)*(ushort *)(this + lVar2 + 4) != 0) {
      switch(this[*(ushort *)(this + lVar2 + 4)].super_Table) {
      case (Table)0x1:
        if (str != (String *)0x0) {
          bVar1 = Attacker::Verify((Attacker *)str,verifier);
          goto LAB_0019af40;
        }
        break;
      case (Table)0x2:
      case (Table)0x3:
      case (Table)0x4:
        uVar3 = (long)str - (long)verifier->buf_;
        if (((uVar3 & 3) != 0) && (((verifier->opts_).check_alignment & 1U) != 0)) {
          return false;
        }
        if (verifier->size_ < 5) {
          return false;
        }
        if (verifier->size_ - 4 < uVar3) {
          return false;
        }
        break;
      case (Table)0x5:
      case (Table)0x6:
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
LAB_0019af40:
        if (bVar1 == false) {
          return false;
        }
      }
    }
  }
  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8);
  if (!bVar1) {
    return false;
  }
  if (((8 < *(ushort *)(this + -(long)*(int *)this)) &&
      (uVar3 = (ulong)*(ushort *)(this + (8 - (long)*(int *)this)), uVar3 != 0)) &&
     (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                        (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),1,
                         (size_t *)0x0), !bVar1)) {
    return false;
  }
  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10);
  if (!bVar1) {
    return false;
  }
  lVar2 = -(long)*(int *)this;
  if ((10 < *(ushort *)(this + -(long)*(int *)this)) &&
     (uVar3 = (ulong)*(ushort *)(this + lVar2 + 10), uVar3 != 0)) {
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                      (verifier,(uint8_t *)(this + *(uint *)(this + uVar3) + uVar3),4,(size_t *)0x0)
    ;
    if (!bVar1) {
      return false;
    }
    lVar2 = -(long)*(int *)this;
  }
  if (*(ushort *)(this + lVar2) < 0xb) {
    values = (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0;
    types = (Vector<unsigned_char,_unsigned_int> *)0x0;
    if (*(ushort *)(this + lVar2) < 9) goto LAB_0019b04c;
  }
  else {
    uVar3 = (ulong)*(ushort *)(this + lVar2 + 10);
    if (uVar3 == 0) {
      values = (Vector<flatbuffers::Offset<void>,_unsigned_int> *)0x0;
    }
    else {
      values = (Vector<flatbuffers::Offset<void>,_unsigned_int> *)
               (this + *(uint *)(this + uVar3) + uVar3);
    }
  }
  uVar3 = (ulong)*(ushort *)(this + lVar2 + 8);
  if (uVar3 == 0) {
    types = (Vector<unsigned_char,_unsigned_int> *)0x0;
  }
  else {
    types = (Vector<unsigned_char,_unsigned_int> *)(this + *(uint *)(this + uVar3) + uVar3);
  }
LAB_0019b04c:
  bVar1 = VerifyCharacterVector(verifier,values,types);
  if (!bVar1) {
    return false;
  }
  verifier->depth_ = verifier->depth_ - 1;
  return true;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<uint8_t>(verifier, VT_MAIN_CHARACTER_TYPE, 1) &&
           VerifyOffset(verifier, VT_MAIN_CHARACTER) &&
           VerifyCharacter(verifier, main_character(), main_character_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS_TYPE) &&
           verifier.VerifyVector(characters_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS) &&
           verifier.VerifyVector(characters()) &&
           VerifyCharacterVector(verifier, characters(), characters_type()) &&
           verifier.EndTable();
  }